

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlist.cpp
# Opt level: O3

QStringList *
QtPrivate::QStringList_filter
          (QStringList *__return_storage_ptr__,QStringList *that,QLatin1StringMatcher *matcher)

{
  qsizetype qVar1;
  long lVar2;
  QString *s;
  QString *args;
  QStringView haystack;
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).size = 0;
  lVar2 = (that->d).size;
  if (lVar2 != 0) {
    args = (that->d).ptr;
    lVar2 = lVar2 * 0x18;
    do {
      haystack.m_data = (args->d).ptr;
      haystack.m_size = (args->d).size;
      qVar1 = QLatin1StringMatcher::indexIn(matcher,haystack,0);
      if (qVar1 != -1) {
        QMovableArrayOps<QString>::emplace<QString_const&>
                  ((QMovableArrayOps<QString> *)__return_storage_ptr__,
                   (__return_storage_ptr__->d).size,args);
        QList<QString>::end(__return_storage_ptr__);
      }
      args = args + 1;
      lVar2 = lVar2 + -0x18;
    } while (lVar2 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

QStringList QtPrivate::QStringList_filter(const QStringList &that, const QLatin1StringMatcher &matcher)
{
    QStringList res;
    for (const auto &s : that) {
        if (matcher.indexIn(s) != -1)
            res.append(s);
    }
    return res;
}